

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall
sglr::ReferenceContext::drawElementsIndirect
          (ReferenceContext *this,deUint32 mode,deUint32 type,void *indirect)

{
  DataBuffer *pDVar1;
  pointer puVar2;
  pointer puVar3;
  bool bVar4;
  undefined8 in_RAX;
  undefined4 uVar8;
  void *pvVar5;
  pointer puVar6;
  uint *puVar7;
  VertexArray *pVVar9;
  byte bVar10;
  
  uVar8 = (undefined4)((ulong)in_RAX >> 0x20);
  bVar4 = predrawErrorChecks(this,mode);
  if (bVar4) {
    if ((type - 0x1401 < 5) && ((0x15U >> (type - 0x1401 & 0x1f) & 1) != 0)) {
      pVVar9 = &this->m_clientVertexArray;
      if (this->m_vertexArrayBinding != (VertexArray *)0x0) {
        pVVar9 = this->m_vertexArrayBinding;
      }
      if (((pVVar9->m_elementArrayBufferBinding != (DataBuffer *)0x0) &&
          (pDVar1 = this->m_drawIndirectBufferBinding, pDVar1 != (DataBuffer *)0x0)) &&
         (((ulong)indirect & 3) == 0)) {
        puVar2 = (pDVar1->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        puVar3 = (pDVar1->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        pvVar5 = (void *)(long)((int)puVar3 - (int)puVar2);
        if ((indirect <= pvVar5) && ((void *)((long)indirect + 0x14U) <= pvVar5)) {
          puVar6 = (pointer)0x0;
          if (puVar2 != puVar3) {
            puVar6 = puVar2;
          }
          if (*(int *)(puVar6 + 0x10 + (long)indirect) == 0) {
            puVar7 = (uint *)(puVar6 + (long)indirect);
            if ((-1 < (int)*puVar7) && (-1 < (int)puVar7[1])) {
              bVar10 = 2 - (type == 0x1403);
              if (type == 0x1401) {
                bVar10 = 0;
              }
              (*(this->super_Context)._vptr_Context[0x6d])
                        (this,mode,(ulong)*puVar7,(ulong)type,(ulong)puVar7[2] << (bVar10 & 0x3f),
                         (ulong)puVar7[1],CONCAT44(uVar8,puVar7[3]));
              return;
            }
            if (this->m_lastError != 0) {
              return;
            }
            this->m_lastError = 0x501;
            return;
          }
        }
      }
      if (this->m_lastError == 0) {
        this->m_lastError = 0x502;
      }
    }
    else if (this->m_lastError == 0) {
      this->m_lastError = 0x500;
    }
  }
  return;
}

Assistant:

void ReferenceContext::drawElementsIndirect	(deUint32 mode, deUint32 type, const void *indirect)
{
	struct DrawElementsIndirectCommand
	{
		deUint32 count;
		deUint32 primCount;
		deUint32 firstIndex;
		deInt32  baseVertex;
		deUint32 reservedMustBeZero;
	};

	const DrawElementsIndirectCommand* command;

	// Check errors

	if (!predrawErrorChecks(mode))
		return;

	RC_IF_ERROR(type != GL_UNSIGNED_BYTE &&
				type != GL_UNSIGNED_SHORT &&
				type != GL_UNSIGNED_INT, GL_INVALID_ENUM, RC_RET_VOID);

	RC_IF_ERROR(!getBufferBinding(GL_ELEMENT_ARRAY_BUFFER), GL_INVALID_OPERATION, RC_RET_VOID);

	// Check pointer validity

	RC_IF_ERROR(m_drawIndirectBufferBinding == DE_NULL, GL_INVALID_OPERATION, RC_RET_VOID);
	RC_IF_ERROR(!deIsAlignedPtr(indirect, 4), GL_INVALID_OPERATION, RC_RET_VOID);

	// \note watch for overflows, indirect might be close to 0xFFFFFFFF and indirect+something might overflow
	RC_IF_ERROR((size_t)((const char*)indirect - (const char*)DE_NULL)                                       > (size_t)m_drawIndirectBufferBinding->getSize(), GL_INVALID_OPERATION, RC_RET_VOID);
	RC_IF_ERROR((size_t)((const char*)indirect - (const char*)DE_NULL) + sizeof(DrawElementsIndirectCommand) > (size_t)m_drawIndirectBufferBinding->getSize(), GL_INVALID_OPERATION, RC_RET_VOID);

	// Check values

	command = (const DrawElementsIndirectCommand*)(m_drawIndirectBufferBinding->getData() + ((const char*)indirect - (const char*)DE_NULL));
	RC_IF_ERROR(command->reservedMustBeZero != 0, GL_INVALID_OPERATION, RC_RET_VOID);

	// Check command error conditions
	RC_IF_ERROR((int)command->count < 0 || (int)command->primCount < 0, GL_INVALID_VALUE, RC_RET_VOID);

	// Draw
	{
		const size_t			sizeOfType		= (type == GL_UNSIGNED_BYTE) ?  (1) : ((type == GL_UNSIGNED_SHORT) ? (2) : (4));
		const void*				indicesPtr		= (deUint8*)DE_NULL + (command->firstIndex * sizeOfType);

		drawElementsInstancedBaseVertex(mode, (int)command->count, type, indicesPtr, (int)command->primCount, command->baseVertex);
	}
}